

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  uint *puVar1;
  float fVar2;
  float fVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  ImFontGlyph *pIVar10;
  int iVar11;
  char *pcVar12;
  char *in_text;
  ImDrawIdx IVar13;
  char *text_end_00;
  float scale;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float local_9c;
  float local_88;
  uint c;
  ulong local_60;
  ImDrawIdx *local_58;
  ImDrawVert *local_50;
  uint local_44;
  int local_40;
  int local_3c;
  char *local_38;
  
  if (text_end == (char *)0x0) {
    sVar7 = strlen(text_begin);
    text_end = text_begin + sVar7;
  }
  fVar17 = (float)(int)pos.y;
  fVar14 = clip_rect->w;
  if (fVar17 <= fVar14) {
    scale = size / this->FontSize;
    fVar15 = this->FontSize * scale;
    if ((wrap_width <= 0.0) && (fVar18 = clip_rect->y, fVar17 + fVar15 < fVar18)) {
      while ((fVar16 = fVar15 + fVar17, fVar16 < fVar18 && (text_begin < text_end))) {
        pvVar8 = memchr(text_begin,10,(long)text_end - (long)text_begin);
        text_begin = (char *)((long)pvVar8 + 1);
        fVar17 = fVar16;
        if (pvVar8 == (void *)0x0) {
          text_begin = text_end;
        }
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar9 = text_begin, fVar18 = fVar17, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar9, fVar18 < fVar14 && (pcVar9 < text_end))) {
        pvVar8 = memchr(pcVar9,10,(long)text_end - (long)pcVar9);
        pcVar9 = (char *)((long)pvVar8 + 1);
        if (pvVar8 == (void *)0x0) {
          pcVar9 = text_end;
        }
        fVar18 = fVar18 + fVar15;
      }
    }
    if (text_begin != text_end_00) {
      local_88 = pos.x;
      fVar16 = (float)(int)local_88;
      iVar11 = (int)text_end_00 - (int)text_begin;
      local_3c = iVar11 * 6;
      local_40 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_3c,iVar11 * 4);
      local_50 = draw_list->_VtxWritePtr;
      local_58 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_44 = col | 0xffffff;
      local_38 = (char *)0x0;
      pcVar9 = local_38;
      fVar14 = fVar16;
      local_9c = fVar16;
      fVar18 = fVar17;
      pcVar12 = text_begin;
LAB_001cec34:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar12;
        fVar2 = fVar18;
        fVar24 = local_9c;
        pcVar6 = local_38;
        if (0.0 < wrap_width) {
          if (pcVar9 == (char *)0x0) {
            pcVar9 = CalcWordWrapPositionA
                               (this,scale,text_begin,text_end_00,(fVar16 - fVar14) + wrap_width);
            pcVar9 = pcVar9 + (pcVar9 == text_begin);
          }
          in_text = text_begin;
          fVar2 = fVar17;
          fVar24 = fVar14;
          pcVar6 = pcVar9;
          if (pcVar9 <= text_begin) {
            fVar17 = fVar17 + fVar15;
            do {
              pcVar9 = text_begin;
              text_begin = pcVar9;
              if (text_end_00 <= pcVar9) goto LAB_001cecdb;
              cVar4 = *pcVar9;
              text_begin = pcVar9 + 1;
            } while ((cVar4 == '\t') || (cVar4 == ' '));
            text_begin = pcVar9 + 1;
            if (cVar4 != '\n') {
              text_begin = pcVar9;
            }
LAB_001cecdb:
            pcVar9 = (char *)0x0;
            fVar14 = fVar16;
            goto LAB_001cec34;
          }
        }
        local_38 = pcVar6;
        local_9c = fVar24;
        fVar17 = fVar2;
        c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar11 = ImTextCharFromUtf8(&c,in_text,text_end_00);
          if (c == 0) break;
          text_begin = in_text + iVar11;
        }
        else {
          text_begin = in_text + 1;
        }
        fVar14 = local_9c;
        fVar18 = fVar17;
        pcVar12 = text_begin;
        if (0x1f < c) {
LAB_001ced71:
          pIVar10 = FindGlyph(this,(ImWchar)c);
          pcVar9 = local_38;
          if (pIVar10 != (ImFontGlyph *)0x0) {
            fVar14 = pIVar10->AdvanceX * scale;
            if (((undefined1  [40])*pIVar10 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
              fVar24 = pIVar10->X0 * scale + local_9c;
              fVar2 = clip_rect->z;
              if (fVar24 <= fVar2) {
                fVar25 = pIVar10->X1 * scale + local_9c;
                fVar3 = clip_rect->x;
                if (fVar3 <= fVar25) {
                  fVar26 = pIVar10->Y0 * scale + fVar17;
                  fVar21 = pIVar10->Y1 * scale + fVar17;
                  fVar19 = pIVar10->U0;
                  fVar23 = pIVar10->V0;
                  fVar22 = pIVar10->U1;
                  fVar20 = pIVar10->V1;
                  if (cpu_fine_clip) {
                    if (fVar24 < fVar3) {
                      fVar19 = fVar19 + (fVar22 - fVar19) *
                                        (1.0 - (fVar25 - fVar3) / (fVar25 - fVar24));
                      fVar24 = fVar3;
                    }
                    fVar3 = clip_rect->y;
                    if (fVar26 < fVar3) {
                      fVar23 = fVar23 + (fVar20 - fVar23) *
                                        (1.0 - (fVar21 - fVar3) / (fVar21 - fVar26));
                      fVar26 = fVar3;
                    }
                    if (fVar2 < fVar25) {
                      fVar22 = (fVar22 - fVar19) * ((fVar2 - fVar24) / (fVar25 - fVar24)) + fVar19;
                      fVar25 = fVar2;
                    }
                    fVar2 = clip_rect->w;
                    if (fVar2 < fVar21) {
                      fVar20 = (fVar20 - fVar23) * ((fVar2 - fVar26) / (fVar21 - fVar26)) + fVar23;
                      fVar21 = fVar2;
                    }
                    if (fVar21 <= fVar26) {
                      local_9c = local_9c + fVar14;
                      fVar14 = local_9c;
                      goto LAB_001cec34;
                    }
                  }
                  uVar5 = local_44;
                  if (((undefined1  [40])*pIVar10 & (undefined1  [40])0x1) == (undefined1  [40])0x0)
                  {
                    uVar5 = col;
                  }
                  IVar13 = (ImDrawIdx)local_60;
                  *local_58 = IVar13;
                  local_58[1] = IVar13 + 1;
                  local_58[2] = IVar13 + 2;
                  local_58[3] = IVar13;
                  local_58[4] = IVar13 + 2;
                  local_58[5] = IVar13 + 3;
                  (local_50->pos).x = fVar24;
                  (local_50->pos).y = fVar26;
                  local_50->col = uVar5;
                  (local_50->uv).x = fVar19;
                  (local_50->uv).y = fVar23;
                  local_50[1].pos.x = fVar25;
                  local_50[1].pos.y = fVar26;
                  local_50[1].col = uVar5;
                  local_50[1].uv.x = fVar22;
                  local_50[1].uv.y = fVar23;
                  local_50[2].pos.x = fVar25;
                  local_50[2].pos.y = fVar21;
                  local_50[2].col = uVar5;
                  local_50[2].uv.x = fVar22;
                  local_50[2].uv.y = fVar20;
                  local_50[3].pos.x = fVar24;
                  local_50[3].pos.y = fVar21;
                  local_50[3].col = uVar5;
                  local_50[3].uv.x = fVar19;
                  local_50[3].uv.y = fVar20;
                  local_50 = local_50 + 4;
                  local_60 = (ulong)((int)local_60 + 4);
                  local_58 = local_58 + 6;
                }
              }
            }
            local_9c = local_9c + fVar14;
            fVar14 = local_9c;
          }
          goto LAB_001cec34;
        }
        pcVar9 = local_38;
        if (c != 10) {
          if (c != 0xd) goto LAB_001ced71;
          goto LAB_001cec34;
        }
        fVar17 = fVar17 + fVar15;
        fVar14 = fVar16;
        local_9c = fVar16;
        fVar18 = fVar17;
      } while (fVar17 < clip_rect->w || fVar17 == clip_rect->w);
      (draw_list->VtxBuffer).Size =
           (int)(((long)local_50 - (long)(draw_list->VtxBuffer).Data) / 0x14);
      iVar11 = (int)((ulong)((long)local_58 - (long)(draw_list->IdxBuffer).Data) >> 1);
      (draw_list->IdxBuffer).Size = iVar11;
      puVar1 = &(draw_list->CmdBuffer).Data[(long)(draw_list->CmdBuffer).Size + -1].ElemCount;
      *puVar1 = *puVar1 + (iVar11 - (local_40 + local_3c));
      draw_list->_VtxWritePtr = local_50;
      draw_list->_IdxWritePtr = local_58;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x);
    pos.y = IM_FLOOR(pos.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    const ImU32 col_untinted = col | ~IM_COL32_A_MASK;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // Support for untinted glyphs
                ImU32 glyph_col = glyph->Colored ? col_untinted : col;

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = glyph_col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = glyph_col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = glyph_col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = glyph_col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size - 1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}